

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O3

void __thiscall xray_re::xr_ini_writer::xr_ini_writer(xr_ini_writer *this)

{
  (this->super_xr_memory_writer).super_xr_writer._vptr_xr_writer =
       (_func_int **)&PTR__xr_writer_0024b410;
  (this->super_xr_memory_writer).super_xr_writer.m_open_chunks.c.
  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  *(size_t *)
   ((long)&(this->super_xr_memory_writer).super_xr_writer.m_open_chunks.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data + 8) = 0;
  ((iterator *)
  ((long)&(this->super_xr_memory_writer).super_xr_writer.m_open_chunks.c.
          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data + 0x10))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_xr_memory_writer).super_xr_writer.m_open_chunks.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data + 0x18) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_xr_memory_writer).super_xr_writer.m_open_chunks.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data + 0x20) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->super_xr_memory_writer).super_xr_writer.m_open_chunks.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data + 0x28) = (_Map_pointer)0x0;
  ((iterator *)
  ((long)&(this->super_xr_memory_writer).super_xr_writer.m_open_chunks.c.
          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data + 0x30))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_xr_memory_writer).super_xr_writer.m_open_chunks.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data + 0x38) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_xr_memory_writer).super_xr_writer.m_open_chunks.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data + 0x40) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->super_xr_memory_writer).super_xr_writer.m_open_chunks.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data + 0x48) = (_Map_pointer)0x0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)
             &(this->super_xr_memory_writer).super_xr_writer.m_open_chunks,0);
  (this->super_xr_memory_writer).m_buffer.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_xr_memory_writer).m_pos = 0;
  (this->super_xr_memory_writer).m_buffer.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_xr_memory_writer).m_buffer.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_xr_memory_writer).super_xr_writer._vptr_xr_writer =
       (_func_int **)&PTR__xr_ini_writer_0024b4e8;
  (this->m_section_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_section_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_section_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_section_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_section_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_section_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_section_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_section_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_section_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_section_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&this->m_section_stack,0);
  return;
}

Assistant:

xr_ini_writer::xr_ini_writer() : m_section_stack() {}